

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

void __thiscall
slang::ast::Compilation::addSystemMethod
          (Compilation *this,SymbolKind typeKind,shared_ptr<slang::ast::SystemSubroutine> *method)

{
  size_t *psVar1;
  long lVar2;
  group_type_pointer pgVar3;
  element_type *peVar4;
  value_type_pointer ppVar5;
  ulong uVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  bool bVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  value_type_pointer unaff_RBX;
  value_type_pointer __u;
  ulong uVar14;
  undefined1 auVar15 [16];
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  try_emplace_args_t local_c1;
  Compilation *local_c0;
  shared_ptr<slang::ast::SystemSubroutine> *local_b8;
  ulong local_b0;
  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,std::shared_ptr<slang::ast::SystemSubroutine>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>const,std::shared_ptr<slang::ast::SystemSubroutine>>>>
  *local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  group_type_pointer local_80;
  uchar local_78;
  uchar uStack_77;
  uchar uStack_76;
  uchar uStack_75;
  uchar uStack_74;
  uchar uStack_73;
  uchar uStack_72;
  uchar uStack_71;
  uchar uStack_70;
  uchar uStack_6f;
  uchar uStack_6e;
  uchar uStack_6d;
  uchar uStack_6c;
  uchar uStack_6b;
  uchar uStack_6a;
  uchar uStack_69;
  size_t seed;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind> local_48;
  
  local_a8 = (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,std::shared_ptr<slang::ast::SystemSubroutine>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>const,std::shared_ptr<slang::ast::SystemSubroutine>>>>
              *)&this->methodMap;
  peVar4 = (method->super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_48.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>
  .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl.
  _M_str = (peVar4->name)._M_dataplus._M_p;
  local_48.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>
  .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl.
  _M_len = (peVar4->name)._M_string_length;
  seed = 0;
  local_48.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>
  .super__Tuple_impl<1UL,_slang::ast::SymbolKind>.
  super__Head_base<1UL,_slang::ast::SymbolKind,_false>._M_head_impl =
       (_Head_base<1UL,_slang::ast::SymbolKind,_false>)
       (_Head_base<1UL,_slang::ast::SymbolKind,_false>)typeKind;
  slang::detail::hashing::
  HashValueImpl<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_1UL>
  ::apply(&seed,&local_48);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = seed;
  local_b0 = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar8,8) ^
             SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar8,0);
  uVar14 = local_b0 >>
           ((byte)(this->methodMap).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  lVar2 = (local_b0 & 0xff) * 4;
  uVar16 = (&UNK_0047c76c)[lVar2];
  uVar17 = (&UNK_0047c76d)[lVar2];
  uVar18 = (&UNK_0047c76e)[lVar2];
  uVar19 = (&UNK_0047c76f)[lVar2];
  uVar13 = (ulong)((uint)local_b0 & 7);
  uVar12 = 0;
  uVar20 = uVar16;
  uVar21 = uVar17;
  uVar22 = uVar18;
  uVar23 = uVar19;
  uVar24 = uVar16;
  uVar25 = uVar17;
  uVar26 = uVar18;
  uVar27 = uVar19;
  uVar28 = uVar16;
  uVar29 = uVar17;
  uVar30 = uVar18;
  uVar31 = uVar19;
  local_88 = uVar14;
  do {
    local_80 = (this->methodMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
               .arrays.groups_;
    pgVar3 = local_80 + uVar14;
    auVar15[0] = -(pgVar3->m[0].n == uVar16);
    auVar15[1] = -(pgVar3->m[1].n == uVar17);
    auVar15[2] = -(pgVar3->m[2].n == uVar18);
    auVar15[3] = -(pgVar3->m[3].n == uVar19);
    auVar15[4] = -(pgVar3->m[4].n == uVar20);
    auVar15[5] = -(pgVar3->m[5].n == uVar21);
    auVar15[6] = -(pgVar3->m[6].n == uVar22);
    auVar15[7] = -(pgVar3->m[7].n == uVar23);
    auVar15[8] = -(pgVar3->m[8].n == uVar24);
    auVar15[9] = -(pgVar3->m[9].n == uVar25);
    auVar15[10] = -(pgVar3->m[10].n == uVar26);
    auVar15[0xb] = -(pgVar3->m[0xb].n == uVar27);
    auVar15[0xc] = -(pgVar3->m[0xc].n == uVar28);
    auVar15[0xd] = -(pgVar3->m[0xd].n == uVar29);
    auVar15[0xe] = -(pgVar3->m[0xe].n == uVar30);
    auVar15[0xf] = -(pgVar3->m[0xf].n == uVar31);
    uVar10 = (uint)(ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe);
    uVar11 = uVar12;
    local_90 = uVar14;
    if (uVar10 != 0) {
      ppVar5 = (this->methodMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
               .arrays.elements_;
      local_c0 = this;
      local_b8 = method;
      local_a0 = uVar12;
      local_98 = uVar13;
      local_78 = uVar16;
      uStack_77 = uVar17;
      uStack_76 = uVar18;
      uStack_75 = uVar19;
      uStack_74 = uVar20;
      uStack_73 = uVar21;
      uStack_72 = uVar22;
      uStack_71 = uVar23;
      uStack_70 = uVar24;
      uStack_6f = uVar25;
      uStack_6e = uVar26;
      uStack_6d = uVar27;
      uStack_6c = uVar28;
      uStack_6b = uVar29;
      uStack_6a = uVar30;
      uStack_69 = uVar31;
      do {
        uVar7 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
          }
        }
        __u = ppVar5 + uVar14 * 0xf + (ulong)uVar7;
        bVar9 = std::
                __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_0UL,_2UL>
                ::__eq(&local_48,&__u->first);
        this = local_c0;
        method = local_b8;
        if (bVar9) goto LAB_00143613;
        uVar10 = uVar10 - 1 & uVar10;
      } while (uVar10 != 0);
      uVar11 = local_a0;
      uVar13 = local_98;
      __u = unaff_RBX;
      uVar16 = local_78;
      uVar17 = uStack_77;
      uVar18 = uStack_76;
      uVar19 = uStack_75;
      uVar20 = uStack_74;
      uVar21 = uStack_73;
      uVar22 = uStack_72;
      uVar23 = uStack_71;
      uVar24 = uStack_70;
      uVar25 = uStack_6f;
      uVar26 = uStack_6e;
      uVar27 = uStack_6d;
      uVar28 = uStack_6c;
      uVar29 = uStack_6b;
      uVar30 = uStack_6a;
      uVar31 = uStack_69;
      if (bVar9) goto LAB_00143613;
    }
    if ((local_80[uVar14].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[uVar13]) == 0) break;
    uVar6 = (this->methodMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
            .arrays.groups_size_mask;
    uVar12 = uVar11 + 1;
    uVar14 = local_90 + uVar11 + 1 & uVar6;
  } while (uVar12 <= uVar6);
  __u = (value_type_pointer)0x0;
LAB_00143613:
  if (__u == (value_type_pointer)0x0) {
    if ((this->methodMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
        .size_ctrl.size <
        (this->methodMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,std::shared_ptr<slang::ast::SystemSubroutine>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>const,std::shared_ptr<slang::ast::SystemSubroutine>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,std::shared_ptr<slang::ast::SystemSubroutine>const&>
                ((locator *)&seed,local_a8,(arrays_type *)local_a8,local_88,local_b0,&local_c1,
                 &local_48,method);
      psVar1 = &(this->methodMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,std::shared_ptr<slang::ast::SystemSubroutine>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>const,std::shared_ptr<slang::ast::SystemSubroutine>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,std::shared_ptr<slang::ast::SystemSubroutine>const&>
                ((locator *)&seed,local_a8,local_b0,&local_c1,&local_48,method);
    }
  }
  return;
}

Assistant:

void Compilation::addSystemMethod(SymbolKind typeKind,
                                  const std::shared_ptr<SystemSubroutine>& method) {
    SLANG_ASSERT(!isFrozen());
    SLANG_ASSERT(!method->name.empty());
    SLANG_ASSERT(method->knownNameId == KnownSystemName::Unknown);
    methodMap.emplace(std::make_tuple(std::string_view(method->name), typeKind), method);
}